

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O1

void ConvertBGR24ToY_SSE2(uint8_t *bgr,uint8_t *y,int width)

{
  uint8_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  unkuint9 Var50;
  undefined1 auVar51 [11];
  undefined1 auVar52 [15];
  unkuint9 Var53;
  undefined1 auVar54 [11];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  unkuint9 Var57;
  undefined1 auVar58 [11];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar68;
  byte *pbVar69;
  long lVar70;
  long lVar71;
  byte bVar73;
  undefined1 uVar74;
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  unkint10 Var77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined2 uVar80;
  undefined2 uVar86;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  __m128i bgr_plane [6];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  
  auVar67 = _DAT_00156a80;
  auVar66 = _DAT_00156a70;
  if ((int)(width & 0xffffffe0U) < 1) {
    iVar68 = 0;
  }
  else {
    lVar70 = 0;
    do {
      bgr_plane[0][0]._0_1_ = *bgr;
      bgr_plane[0][0]._1_1_ = bgr[3];
      bgr_plane[0][0]._2_1_ = bgr[6];
      bgr_plane[0][0]._3_1_ = bgr[9];
      bgr_plane[0][0]._4_1_ = bgr[0xc];
      bgr_plane[0][0]._5_1_ = bgr[0xf];
      bgr_plane[0][0]._6_1_ = bgr[0x12];
      bgr_plane[0][0]._7_1_ = bgr[0x15];
      bgr_plane[0][1]._0_1_ = bgr[0x18];
      bgr_plane[0][1]._1_1_ = bgr[0x1b];
      bgr_plane[0][1]._2_1_ = bgr[0x1e];
      bgr_plane[0][1]._3_1_ = bgr[0x21];
      bgr_plane[0][1]._4_1_ = bgr[0x24];
      bgr_plane[0][1]._5_1_ = bgr[0x27];
      bgr_plane[0][1]._6_1_ = bgr[0x2a];
      bgr_plane[0][1]._7_1_ = bgr[0x2d];
      bgr_plane[1][0]._0_1_ = bgr[0x30];
      bgr_plane[1][0]._1_1_ = bgr[0x33];
      bgr_plane[1][0]._2_1_ = bgr[0x36];
      bgr_plane[1][0]._3_1_ = bgr[0x39];
      bgr_plane[1][0]._4_1_ = bgr[0x3c];
      bgr_plane[1][0]._5_1_ = bgr[0x3f];
      bgr_plane[1][0]._6_1_ = bgr[0x42];
      bgr_plane[1][0]._7_1_ = bgr[0x45];
      bgr_plane[1][1]._0_1_ = bgr[0x48];
      bgr_plane[1][1]._1_1_ = bgr[0x4b];
      bgr_plane[1][1]._2_1_ = bgr[0x4e];
      bgr_plane[1][1]._3_1_ = bgr[0x51];
      bgr_plane[1][1]._4_1_ = bgr[0x54];
      bgr_plane[1][1]._5_1_ = bgr[0x57];
      bgr_plane[1][1]._6_1_ = bgr[0x5a];
      bgr_plane[1][1]._7_1_ = bgr[0x5d];
      bgr_plane[2][0]._0_1_ = bgr[1];
      bgr_plane[2][0]._1_1_ = bgr[4];
      bgr_plane[2][0]._2_1_ = bgr[7];
      bgr_plane[2][0]._3_1_ = bgr[10];
      bgr_plane[2][0]._4_1_ = bgr[0xd];
      bgr_plane[2][0]._5_1_ = bgr[0x10];
      bgr_plane[2][0]._6_1_ = bgr[0x13];
      bgr_plane[2][0]._7_1_ = bgr[0x16];
      bgr_plane[2][1]._0_1_ = bgr[0x19];
      bgr_plane[2][1]._1_1_ = bgr[0x1c];
      bgr_plane[2][1]._2_1_ = bgr[0x1f];
      bgr_plane[2][1]._3_1_ = bgr[0x22];
      bgr_plane[2][1]._4_1_ = bgr[0x25];
      bgr_plane[2][1]._5_1_ = bgr[0x28];
      bgr_plane[2][1]._6_1_ = bgr[0x2b];
      bgr_plane[2][1]._7_1_ = bgr[0x2e];
      bgr_plane[3][0]._0_1_ = bgr[0x31];
      bgr_plane[3][0]._1_1_ = bgr[0x34];
      bgr_plane[3][0]._2_1_ = bgr[0x37];
      bgr_plane[3][0]._3_1_ = bgr[0x3a];
      bgr_plane[3][0]._4_1_ = bgr[0x3d];
      bgr_plane[3][0]._5_1_ = bgr[0x40];
      bgr_plane[3][0]._6_1_ = bgr[0x43];
      bgr_plane[3][0]._7_1_ = bgr[0x46];
      bgr_plane[3][1]._0_1_ = bgr[0x49];
      bgr_plane[3][1]._1_1_ = bgr[0x4c];
      bgr_plane[3][1]._2_1_ = bgr[0x4f];
      bgr_plane[3][1]._3_1_ = bgr[0x52];
      bgr_plane[3][1]._4_1_ = bgr[0x55];
      bgr_plane[3][1]._5_1_ = bgr[0x58];
      bgr_plane[3][1]._6_1_ = bgr[0x5b];
      bgr_plane[3][1]._7_1_ = bgr[0x5e];
      bgr_plane[4][0]._0_1_ = bgr[2];
      bgr_plane[4][0]._1_1_ = bgr[5];
      bgr_plane[4][0]._2_1_ = bgr[8];
      bgr_plane[4][0]._3_1_ = bgr[0xb];
      bgr_plane[4][0]._4_1_ = bgr[0xe];
      bgr_plane[4][0]._5_1_ = bgr[0x11];
      bgr_plane[4][0]._6_1_ = bgr[0x14];
      bgr_plane[4][0]._7_1_ = bgr[0x17];
      bgr_plane[4][1]._0_1_ = bgr[0x1a];
      bgr_plane[4][1]._1_1_ = bgr[0x1d];
      bgr_plane[4][1]._2_1_ = bgr[0x20];
      bgr_plane[4][1]._3_1_ = bgr[0x23];
      bgr_plane[4][1]._4_1_ = bgr[0x26];
      bgr_plane[4][1]._5_1_ = bgr[0x29];
      bgr_plane[4][1]._6_1_ = bgr[0x2c];
      bgr_plane[4][1]._7_1_ = bgr[0x2f];
      bgr_plane[5][0]._0_1_ = bgr[0x32];
      bgr_plane[5][0]._1_1_ = bgr[0x35];
      bgr_plane[5][0]._2_1_ = bgr[0x38];
      bgr_plane[5][0]._3_1_ = bgr[0x3b];
      bgr_plane[5][0]._4_1_ = bgr[0x3e];
      bgr_plane[5][0]._5_1_ = bgr[0x41];
      bgr_plane[5][0]._6_1_ = bgr[0x44];
      bgr_plane[5][0]._7_1_ = bgr[0x47];
      bgr_plane[5][1]._0_1_ = bgr[0x4a];
      bgr_plane[5][1]._1_1_ = bgr[0x4d];
      bgr_plane[5][1]._2_1_ = bgr[0x50];
      bgr_plane[5][1]._3_1_ = bgr[0x53];
      bgr_plane[5][1]._4_1_ = bgr[0x56];
      bgr_plane[5][1]._5_1_ = bgr[0x59];
      bgr_plane[5][1]._6_1_ = bgr[0x5c];
      bgr_plane[5][1]._7_1_ = bgr[0x5f];
      iVar68 = (int)lVar70;
      lVar71 = 0;
      do {
        auVar72 = *(undefined1 (*) [16])((long)bgr_plane[0] + lVar71);
        auVar85 = *(undefined1 (*) [16])((long)bgr_plane[2] + lVar71);
        auVar79 = *(undefined1 (*) [16])((long)bgr_plane[4] + lVar71);
        auVar18[0xd] = 0;
        auVar18._0_13_ = auVar72._0_13_;
        auVar18[0xe] = auVar72[7];
        auVar21[0xc] = auVar72[6];
        auVar21._0_12_ = auVar72._0_12_;
        auVar21._13_2_ = auVar18._13_2_;
        auVar24[0xb] = 0;
        auVar24._0_11_ = auVar72._0_11_;
        auVar24._12_3_ = auVar21._12_3_;
        auVar27[10] = auVar72[5];
        auVar27._0_10_ = auVar72._0_10_;
        auVar27._11_4_ = auVar24._11_4_;
        auVar32[9] = 0;
        auVar32._0_9_ = auVar72._0_9_;
        auVar32._10_5_ = auVar27._10_5_;
        auVar37[8] = auVar72[4];
        auVar37._0_8_ = auVar72._0_8_;
        auVar37._9_6_ = auVar32._9_6_;
        auVar49._7_8_ = 0;
        auVar49._0_7_ = auVar37._8_7_;
        Var50 = CONCAT81(SUB158(auVar49 << 0x40,7),auVar72[3]);
        auVar60._9_6_ = 0;
        auVar60._0_9_ = Var50;
        auVar51._1_10_ = SUB1510(auVar60 << 0x30,5);
        auVar51[0] = auVar72[2];
        auVar61._11_4_ = 0;
        auVar61._0_11_ = auVar51;
        auVar46[2] = auVar72[1];
        auVar46._0_2_ = auVar72._0_2_;
        auVar46._3_12_ = SUB1512(auVar61 << 0x20,3);
        uVar74 = auVar85[7];
        auVar19[0xd] = 0;
        auVar19._0_13_ = auVar85._0_13_;
        auVar19[0xe] = uVar74;
        auVar22[0xc] = auVar85[6];
        auVar22._0_12_ = auVar85._0_12_;
        auVar22._13_2_ = auVar19._13_2_;
        auVar25[0xb] = 0;
        auVar25._0_11_ = auVar85._0_11_;
        auVar25._12_3_ = auVar22._12_3_;
        auVar28[10] = auVar85[5];
        auVar28._0_10_ = auVar85._0_10_;
        auVar28._11_4_ = auVar25._11_4_;
        auVar33[9] = 0;
        auVar33._0_9_ = auVar85._0_9_;
        auVar33._10_5_ = auVar28._10_5_;
        auVar38[8] = auVar85[4];
        auVar38._0_8_ = auVar85._0_8_;
        auVar38._9_6_ = auVar33._9_6_;
        auVar52._7_8_ = 0;
        auVar52._0_7_ = auVar38._8_7_;
        Var53 = CONCAT81(SUB158(auVar52 << 0x40,7),auVar85[3]);
        auVar62._9_6_ = 0;
        auVar62._0_9_ = Var53;
        auVar54._1_10_ = SUB1510(auVar62 << 0x30,5);
        auVar54[0] = auVar85[2];
        auVar63._11_4_ = 0;
        auVar63._0_11_ = auVar54;
        uVar80 = auVar85._0_2_;
        auVar47[2] = auVar85[1];
        auVar47._0_2_ = uVar80;
        auVar47._3_12_ = SUB1512(auVar63 << 0x20,3);
        auVar55._13_2_ = 0;
        auVar55._0_13_ = auVar47._2_13_;
        auVar20[0xd] = 0;
        auVar20._0_13_ = auVar79._0_13_;
        auVar20[0xe] = auVar79[7];
        auVar23[0xc] = auVar79[6];
        auVar23._0_12_ = auVar79._0_12_;
        auVar23._13_2_ = auVar20._13_2_;
        auVar26[0xb] = 0;
        auVar26._0_11_ = auVar79._0_11_;
        auVar26._12_3_ = auVar23._12_3_;
        auVar29[10] = auVar79[5];
        auVar29._0_10_ = auVar79._0_10_;
        auVar29._11_4_ = auVar26._11_4_;
        auVar34[9] = 0;
        auVar34._0_9_ = auVar79._0_9_;
        auVar34._10_5_ = auVar29._10_5_;
        auVar39[8] = auVar79[4];
        auVar39._0_8_ = auVar79._0_8_;
        auVar39._9_6_ = auVar34._9_6_;
        auVar56._7_8_ = 0;
        auVar56._0_7_ = auVar39._8_7_;
        Var57 = CONCAT81(SUB158(auVar56 << 0x40,7),auVar79[3]);
        auVar64._9_6_ = 0;
        auVar64._0_9_ = Var57;
        auVar58._1_10_ = SUB1510(auVar64 << 0x30,5);
        auVar58[0] = auVar79[2];
        auVar65._11_4_ = 0;
        auVar65._0_11_ = auVar58;
        auVar48[2] = auVar79[1];
        auVar48._0_2_ = auVar79._0_2_;
        auVar48._3_12_ = SUB1512(auVar65 << 0x20,3);
        auVar59._13_2_ = 0;
        auVar59._0_13_ = auVar48._2_13_;
        uVar86 = (undefined2)Var53;
        auVar93._0_12_ = SUB1512(auVar59 << 0x10,0);
        auVar93._12_2_ = (short)Var57;
        auVar93._14_2_ = uVar86;
        auVar92._12_4_ = auVar93._12_4_;
        auVar92._0_10_ = SUB1510(auVar59 << 0x10,0);
        auVar92._10_2_ = auVar54._0_2_;
        auVar91._10_6_ = auVar92._10_6_;
        auVar91._8_2_ = auVar58._0_2_;
        auVar91._6_2_ = auVar47._2_2_;
        auVar91._4_2_ = auVar48._2_2_;
        auVar91._0_4_ = CONCAT22(uVar80,auVar79._0_2_) & 0xff00ff;
        auVar89._2_2_ = auVar38._8_2_;
        auVar89._0_2_ = auVar39._8_2_;
        auVar89._4_2_ = auVar29._10_2_;
        auVar89._6_2_ = auVar28._10_2_;
        auVar89._8_2_ = auVar23._12_2_;
        auVar89._10_2_ = auVar22._12_2_;
        auVar89[0xc] = auVar79[7];
        auVar89[0xd] = 0;
        auVar89[0xe] = uVar74;
        auVar89[0xf] = 0;
        auVar94._0_12_ = SUB1512(auVar55 << 0x10,0);
        auVar94._12_2_ = uVar86;
        auVar94._14_2_ = (short)Var50;
        auVar90._12_4_ = auVar94._12_4_;
        auVar90._0_10_ = SUB1510(auVar55 << 0x10,0);
        auVar90._10_2_ = auVar51._0_2_;
        auVar82._10_6_ = auVar90._10_6_;
        auVar82._8_2_ = auVar54._0_2_;
        auVar82._6_2_ = auVar46._2_2_;
        auVar82._4_2_ = auVar47._2_2_;
        auVar82._0_4_ = CONCAT22(auVar72._0_2_,uVar80) & 0xff00ff;
        auVar81._2_2_ = auVar37._8_2_;
        auVar81._0_2_ = auVar38._8_2_;
        auVar81._4_2_ = auVar28._10_2_;
        auVar81._6_2_ = auVar27._10_2_;
        auVar81._8_2_ = auVar22._12_2_;
        auVar81._10_2_ = auVar21._12_2_;
        auVar81[0xc] = uVar74;
        auVar81[0xd] = 0;
        auVar81[0xe] = auVar72[7];
        auVar81[0xf] = 0;
        auVar94 = pmaddwd(auVar91,auVar66);
        auVar90 = pmaddwd(auVar89,auVar66);
        auVar75 = pmaddwd(auVar82,auVar67);
        auVar82 = pmaddwd(auVar81,auVar67);
        auVar76._0_4_ = auVar75._0_4_ + auVar94._0_4_ + 0x108000U >> 0x10;
        auVar76._4_4_ = auVar75._4_4_ + auVar94._4_4_ + 0x108000U >> 0x10;
        auVar76._8_4_ = auVar75._8_4_ + auVar94._8_4_ + 0x108000U >> 0x10;
        auVar76._12_4_ = auVar75._12_4_ + auVar94._12_4_ + 0x108000U >> 0x10;
        auVar83._0_4_ = auVar82._0_4_ + auVar90._0_4_ + 0x108000U >> 0x10;
        auVar83._4_4_ = auVar82._4_4_ + auVar90._4_4_ + 0x108000U >> 0x10;
        auVar83._8_4_ = auVar82._8_4_ + auVar90._8_4_ + 0x108000U >> 0x10;
        auVar83._12_4_ = auVar82._12_4_ + auVar90._12_4_ + 0x108000U >> 0x10;
        auVar82 = packssdw(auVar76,auVar83);
        auVar87[1] = 0;
        auVar87[0] = auVar85[8];
        bVar73 = auVar85[0xc];
        uVar74 = auVar85[0xd];
        auVar31[10] = uVar74;
        auVar31._0_10_ = (unkuint10)bVar73 << 0x40;
        auVar31[0xb] = 0;
        auVar84[1] = 0;
        auVar84[0] = auVar79[8];
        Var77 = (unkuint10)auVar79[0xc] << 0x40;
        auVar30[10] = auVar79[0xd];
        auVar30._0_10_ = Var77;
        auVar30[0xb] = 0;
        auVar30[0xc] = auVar79[0xb];
        auVar30[0xd] = 0;
        auVar30[0xe] = auVar85[0xb];
        auVar35[10] = auVar85[10];
        auVar35._0_10_ = Var77;
        auVar35[0xb] = 0;
        auVar35._12_3_ = auVar30._12_3_;
        auVar40._10_5_ = auVar35._10_5_;
        auVar40._0_10_ = (unkuint10)auVar79[10] << 0x40;
        auVar42._8_7_ = auVar40._8_7_;
        auVar42._0_8_ = (ulong)auVar85[9] << 0x30;
        auVar44._6_9_ = auVar42._6_9_;
        auVar44._0_6_ = (uint6)auVar79[9] << 0x20;
        auVar84[2] = auVar85[8];
        auVar84[3] = 0;
        auVar84._4_11_ = auVar44._4_11_;
        auVar84[0xf] = 0;
        auVar78[1] = 0;
        auVar78[0] = auVar79[0xc];
        auVar75[1] = 0;
        auVar75[0] = bVar73;
        auVar78[2] = bVar73;
        auVar78[3] = 0;
        auVar78[4] = auVar79[0xd];
        auVar78[5] = 0;
        auVar78[6] = uVar74;
        auVar78[7] = 0;
        auVar78[8] = auVar79[0xe];
        auVar78[9] = 0;
        auVar78[10] = auVar85[0xe];
        auVar78[0xb] = 0;
        auVar78[0xc] = auVar79[0xf];
        auVar78[0xd] = 0;
        auVar78[0xe] = auVar85[0xf];
        auVar78[0xf] = 0;
        auVar31[0xc] = auVar85[0xb];
        auVar31[0xd] = 0;
        auVar31[0xe] = auVar72[0xb];
        auVar36[10] = auVar72[10];
        auVar36._0_10_ = (unkuint10)bVar73 << 0x40;
        auVar36[0xb] = 0;
        auVar36._12_3_ = auVar31._12_3_;
        auVar41._10_5_ = auVar36._10_5_;
        auVar41._0_10_ = (unkuint10)auVar85[10] << 0x40;
        auVar43._8_7_ = auVar41._8_7_;
        auVar43._0_8_ = (ulong)auVar72[9] << 0x30;
        auVar45._6_9_ = auVar43._6_9_;
        auVar45._0_6_ = (uint6)auVar85[9] << 0x20;
        auVar87[2] = auVar72[8];
        auVar87[3] = 0;
        auVar87._4_11_ = auVar45._4_11_;
        auVar87[0xf] = 0;
        auVar75[2] = auVar72[0xc];
        auVar75[3] = 0;
        auVar75[4] = uVar74;
        auVar75[5] = 0;
        auVar75[6] = auVar72[0xd];
        auVar75[7] = 0;
        auVar75[8] = auVar85[0xe];
        auVar75[9] = 0;
        auVar75[10] = auVar72[0xe];
        auVar75[0xb] = 0;
        auVar75[0xc] = auVar85[0xf];
        auVar75[0xd] = 0;
        auVar75[0xe] = auVar72[0xf];
        auVar75[0xf] = 0;
        auVar85 = pmaddwd(auVar84,auVar66);
        auVar79 = pmaddwd(auVar78,auVar66);
        auVar90 = pmaddwd(auVar87,auVar67);
        auVar72 = pmaddwd(auVar75,auVar67);
        auVar88._0_4_ = auVar90._0_4_ + auVar85._0_4_ + 0x108000 >> 0x10;
        auVar88._4_4_ = auVar90._4_4_ + auVar85._4_4_ + 0x108000 >> 0x10;
        auVar88._8_4_ = auVar90._8_4_ + auVar85._8_4_ + 0x108000 >> 0x10;
        auVar88._12_4_ = auVar90._12_4_ + auVar85._12_4_ + 0x108000 >> 0x10;
        auVar85._0_4_ = auVar72._0_4_ + auVar79._0_4_ + 0x108000 >> 0x10;
        auVar85._4_4_ = auVar72._4_4_ + auVar79._4_4_ + 0x108000 >> 0x10;
        auVar85._8_4_ = auVar72._8_4_ + auVar79._8_4_ + 0x108000 >> 0x10;
        auVar85._12_4_ = auVar72._12_4_ + auVar79._12_4_ + 0x108000 >> 0x10;
        auVar72 = packssdw(auVar88,auVar85);
        sVar2 = auVar82._0_2_;
        sVar3 = auVar82._2_2_;
        sVar4 = auVar82._4_2_;
        sVar5 = auVar82._6_2_;
        sVar6 = auVar82._8_2_;
        sVar7 = auVar82._10_2_;
        sVar8 = auVar82._12_2_;
        sVar9 = auVar82._14_2_;
        sVar10 = auVar72._0_2_;
        sVar11 = auVar72._2_2_;
        sVar12 = auVar72._4_2_;
        sVar13 = auVar72._6_2_;
        sVar14 = auVar72._8_2_;
        sVar15 = auVar72._10_2_;
        sVar16 = auVar72._12_2_;
        sVar17 = auVar72._14_2_;
        puVar1 = y + lVar71 + iVar68;
        *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar82[0] - (0xff < sVar2);
        puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar82[2] - (0xff < sVar3);
        puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar82[4] - (0xff < sVar4);
        puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar82[6] - (0xff < sVar5);
        puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar82[8] - (0xff < sVar6);
        puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar82[10] - (0xff < sVar7);
        puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar82[0xc] - (0xff < sVar8);
        puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar82[0xe] - (0xff < sVar9);
        puVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar72[0] - (0xff < sVar10);
        puVar1[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar72[2] - (0xff < sVar11);
        puVar1[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar72[4] - (0xff < sVar12);
        puVar1[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar72[6] - (0xff < sVar13);
        puVar1[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar72[8] - (0xff < sVar14);
        puVar1[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar72[10] - (0xff < sVar15);
        puVar1[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar72[0xc] - (0xff < sVar16);
        puVar1[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar72[0xe] - (0xff < sVar17);
        lVar71 = lVar71 + 0x10;
      } while (lVar71 == 0x10);
      bgr = bgr + 0x60;
      lVar70 = iVar68 + lVar71;
    } while (iVar68 + (int)lVar71 < (int)(width & 0xffffffe0U));
    iVar68 = iVar68 + (int)lVar71;
  }
  if (iVar68 < width) {
    lVar70 = (long)iVar68;
    pbVar69 = bgr + 2;
    do {
      y[lVar70] = (uint8_t)((uint)pbVar69[-2] * 0x1914 +
                            (uint)pbVar69[-1] * 0x8123 + (uint)*pbVar69 * 0x41c7 + 0x108000 >> 0x10)
      ;
      lVar70 = lVar70 + 1;
      pbVar69 = pbVar69 + 3;
    } while (width != lVar70);
  }
  return;
}

Assistant:

static void ConvertBGR24ToY_SSE2(const uint8_t* bgr, uint8_t* y, int width) {
  const int max_width = width & ~31;
  int i;
  for (i = 0; i < max_width; bgr += 3 * 16 * 2) {
    __m128i bgr_plane[6];
    int j;

    RGB24PackedToPlanar_SSE2(bgr, bgr_plane);

    for (j = 0; j < 2; ++j, i += 16) {
      const __m128i zero = _mm_setzero_si128();
      __m128i r, g, b, Y0, Y1;

      // Convert to 16-bit Y.
      b = _mm_unpacklo_epi8(bgr_plane[0 + j], zero);
      g = _mm_unpacklo_epi8(bgr_plane[2 + j], zero);
      r = _mm_unpacklo_epi8(bgr_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y0);

      // Convert to 16-bit Y.
      b = _mm_unpackhi_epi8(bgr_plane[0 + j], zero);
      g = _mm_unpackhi_epi8(bgr_plane[2 + j], zero);
      r = _mm_unpackhi_epi8(bgr_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y1);

      // Cast to 8-bit and store.
      STORE_16(_mm_packus_epi16(Y0, Y1), y + i);
    }
  }
  for (; i < width; ++i, bgr += 3) {  // left-over
    y[i] = VP8RGBToY(bgr[2], bgr[1], bgr[0], YUV_HALF);
  }
}